

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O1

TokenType __thiscall
soul::
Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>::
skip(Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
     *this)

{
  char *pcVar1;
  byte *in_RAX;
  TokenType TVar2;
  UTF8Reader t;
  UTF8Reader local_18;
  
  if (this->shouldIgnoreComments == true) {
    local_18.data = (char *)in_RAX;
    skipWhitespaceAndComments(this);
  }
  else {
    local_18.data = (this->input).data;
    while( true ) {
      if ((4 < (byte)*local_18.data - 9) && (*local_18.data != 0x20)) break;
      UTF8Reader::operator++(&local_18);
    }
    (this->input).data = local_18.data;
  }
  pcVar1 = (this->currentType).text;
  (this->location).location.data = (this->input).data;
  TVar2 = matchNextToken(this);
  (this->currentType).text = TVar2.text;
  return (TokenType)pcVar1;
}

Assistant:

TokenType skip()
    {
        if (shouldIgnoreComments)
            skipWhitespaceAndComments();
        else
            input = input.findEndOfWhitespace();

        location.location = input;
        auto last = currentType;
        currentType = matchNextToken();
        return last;
    }